

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_while_statement(Parser *this)

{
  AbstractSyntaxNode *pAVar1;
  stringstream buffer;
  Type local_354;
  Token local_350;
  Token local_2f8;
  Token local_2a0;
  Token local_248;
  Token local_1f0;
  Type local_198 [32];
  ios_base local_118 [264];
  
  local_198[0] = kWhileStatement;
  pAVar1 = AbstractSyntaxNode::add_child
                     (this->current_,local_198,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  local_354 = kWhile;
  match(&local_1f0,this,&local_354);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.content_._M_dataplus._M_p != &local_1f0.content_.field_2) {
    operator_delete(local_1f0.content_._M_dataplus._M_p);
  }
  local_354 = kLeftParen;
  match(&local_248,this,&local_354);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.content_._M_dataplus._M_p != &local_248.content_.field_2) {
    operator_delete(local_248.content_._M_dataplus._M_p);
  }
  parse_condition(this);
  local_354 = kRightParen;
  match(&local_2a0,this,&local_354);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.content_._M_dataplus._M_p != &local_2a0.content_.field_2) {
    operator_delete(local_2a0.content_._M_dataplus._M_p);
  }
  local_354 = kLeftBrace;
  match(&local_2f8,this,&local_354);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.content_._M_dataplus._M_p != &local_2f8.content_.field_2) {
    operator_delete(local_2f8.content_._M_dataplus._M_p);
  }
  local_354 = kStatements;
  pAVar1 = AbstractSyntaxNode::add_child
                     (this->current_,&local_354,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar1;
  while ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_start[this->index_ % this->total_].type_ != kRightBrace) {
    parse_statement(this,true);
  }
  local_354 = kRightBrace;
  match(&local_350,this,&local_354);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.content_._M_dataplus._M_p != &local_350.content_.field_2) {
    operator_delete(local_350.content_._M_dataplus._M_p);
  }
  pAVar1 = this->current_->parent_;
  this->current_ = pAVar1;
  this->current_ = pAVar1->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Parser::parse_while_statement() {
    current_ = current_->add_child(Token::Type::kWhileStatement, forward_token());
    std::stringstream buffer;

    match(Token::Type::kWhile);
    match(Token::Type::kLeftParen);
    parse_condition();
    match(Token::Type::kRightParen);
    match(Token::Type::kLeftBrace);
    current_ = current_->add_child(Token::Type::kStatements, forward_token());
    while (forward_token().type() != Token::Type::kRightBrace) {
        parse_statement();
    }
    match(Token::Type::kRightBrace);
    current_ = current_->parent();

    current_ = current_->parent();
}